

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManDupDemiterOrderXors2(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int iVar1;
  undefined8 in_RAX;
  Vec_Int_t *vVec2;
  int *__ptr;
  int iVar2;
  long lVar3;
  undefined4 uStack_38;
  int iObj;
  
  _uStack_38 = in_RAX;
  vVec2 = Vec_IntAlloc(100);
  for (iVar2 = 0; iVar2 < vXors->nSize; iVar2 = iVar2 + 1) {
    iVar1 = Vec_IntEntry(vXors,iVar2);
    _uStack_38 = CONCAT44(iVar1,uStack_38);
    iVar1 = Gia_ManSuppSize(p,&iObj,1);
    Vec_IntPush(vVec2,iVar1);
  }
  __ptr = Abc_MergeSortCost(vVec2->pArray,vVec2->nSize);
  vVec2->nSize = 0;
  for (lVar3 = 0; lVar3 < vXors->nSize; lVar3 = lVar3 + 1) {
    iVar2 = Vec_IntEntry(vXors,__ptr[lVar3]);
    Vec_IntPush(vVec2,iVar2);
  }
  free(__ptr);
  vXors->nSize = 0;
  Vec_IntAppend(vXors,vVec2);
  Vec_IntFree(vVec2);
  return;
}

Assistant:

void Gia_ManDupDemiterOrderXors2( Gia_Man_t * p, Vec_Int_t * vXors )
{
    int i, iObj, * pPerm;
    Vec_Int_t * vSizes = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vXors, iObj, i )
        Vec_IntPush( vSizes, Gia_ManSuppSize(p, &iObj, 1) );
    pPerm = Abc_MergeSortCost( Vec_IntArray(vSizes), Vec_IntSize(vSizes) );
    Vec_IntClear( vSizes );
    for ( i = 0; i < Vec_IntSize(vXors); i++ )
        Vec_IntPush( vSizes, Vec_IntEntry(vXors, pPerm[i]) );
    ABC_FREE( pPerm );
    Vec_IntClear( vXors );
    Vec_IntAppend( vXors, vSizes );
    Vec_IntFree( vSizes );
}